

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  BVH *bvh;
  size_t sVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  size_t sVar68;
  byte bVar69;
  bool bVar70;
  int iVar71;
  AABBNodeMB4D *node1;
  ulong uVar72;
  long lVar73;
  ulong uVar74;
  long lVar75;
  long lVar76;
  size_t i;
  ulong uVar77;
  long lVar78;
  NodeRef root;
  size_t sVar79;
  ulong uVar80;
  byte bVar81;
  byte bVar82;
  byte bVar83;
  undefined4 uVar84;
  vuint<4> *v;
  long lVar85;
  NodeRef *pNVar86;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar87;
  byte bVar88;
  ulong uVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  vfloat_impl<4> vVar114;
  vfloat_impl<4> vVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  float fVar122;
  float fVar123;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar121;
  float fVar124;
  vint4 ai_2;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  vint4 ai;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 in_ZMM2 [64];
  float fVar133;
  float fVar137;
  float fVar138;
  vint4 ai_1;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar139;
  undefined1 auVar136 [16];
  float fVar140;
  float fVar144;
  float fVar145;
  vint4 ai_3;
  undefined1 auVar141 [16];
  float fVar146;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  vint4 bi_1;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  vint4 bi_3;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  vint4 bi_2;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  uint uVar167;
  uint uVar169;
  uint uVar170;
  uint uVar171;
  undefined1 auVar168 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [64];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  uint local_3848;
  QuadMesh *mesh;
  Vec3<embree::vfloat_impl<4>_> p1;
  Precalculations pre;
  undefined1 local_37a8 [16];
  RayK<4> *local_3798;
  ulong local_3790;
  Vec3<embree::vfloat_impl<4>_> p0;
  vint<4> itime;
  undefined8 local_3648;
  undefined8 uStack_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  vfloat<4> t;
  vfloat<4> v_1;
  vfloat<4> u;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar90 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar95 = ZEXT816(0) << 0x40;
    uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar95,5);
    uVar89 = vpcmpeqd_avx512vl(auVar90,(undefined1  [16])valid_i->field_0);
    uVar89 = ((byte)uVar10 & 0xf) & uVar89;
    bVar88 = (byte)uVar89;
    if (bVar88 != 0) {
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar177 = ZEXT1664(auVar90);
      auVar91 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar90);
      auVar93._8_4_ = 0x219392ef;
      auVar93._0_8_ = 0x219392ef219392ef;
      auVar93._12_4_ = 0x219392ef;
      uVar77 = vcmpps_avx512vl(auVar91,auVar93,1);
      bVar70 = (bool)((byte)uVar77 & 1);
      auVar91._0_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * tray.dir.field_0._0_4_;
      bVar70 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar91._4_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * tray.dir.field_0._4_4_;
      bVar70 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar91._8_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * tray.dir.field_0._8_4_;
      bVar70 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar91._12_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * tray.dir.field_0._12_4_;
      auVar92 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar90);
      uVar77 = vcmpps_avx512vl(auVar92,auVar93,1);
      bVar70 = (bool)((byte)uVar77 & 1);
      auVar92._0_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * tray.dir.field_0._16_4_;
      bVar70 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar92._4_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * tray.dir.field_0._20_4_;
      bVar70 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar92._8_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * tray.dir.field_0._24_4_;
      bVar70 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar92._12_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * tray.dir.field_0._28_4_;
      auVar90 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar90);
      uVar77 = vcmpps_avx512vl(auVar90,auVar93,1);
      bVar70 = (bool)((byte)uVar77 & 1);
      auVar90._0_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * tray.dir.field_0._32_4_;
      bVar70 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar90._4_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * tray.dir.field_0._36_4_;
      bVar70 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar90._8_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * tray.dir.field_0._40_4_;
      bVar70 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar90._12_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * tray.dir.field_0._44_4_;
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar178 = ZEXT1664(auVar93);
      auVar94 = vrcp14ps_avx512vl(auVar91);
      auVar91 = vfnmadd213ps_avx512vl(auVar91,auVar94,auVar93);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar91,auVar94,auVar94)
      ;
      auVar91 = vrcp14ps_avx512vl(auVar92);
      auVar92 = vfnmadd213ps_avx512vl(auVar92,auVar91,auVar93);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar92,auVar91,auVar91)
      ;
      auVar91 = vrcp14ps_avx512vl(auVar90);
      auVar90 = vfnmadd213ps_avx512vl(auVar90,auVar91,auVar93);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar90,auVar91,auVar91)
      ;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      tray.org_rdir.field_0._0_4_ = *(float *)ray * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = *(float *)(ray + 4) * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = *(float *)(ray + 8) * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = *(float *)(ray + 0xc) * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      uVar77 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar95,1);
      auVar90 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar77 & 1) * auVar90._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar77 >> 1) & 1) * auVar90._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar77 >> 2) & 1) * auVar90._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar77 >> 3) & 1) * auVar90._12_4_;
      uVar77 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar95,5);
      auVar90 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar70 = (bool)((byte)uVar77 & 1);
      bVar7 = (bool)((byte)(uVar77 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar70 * auVar90._0_4_ | (uint)!bVar70 * 0x60;
      tray.nearXYZ.field_0._20_4_ = (uint)bVar7 * auVar90._4_4_ | (uint)!bVar7 * 0x60;
      tray.nearXYZ.field_0._24_4_ = (uint)bVar8 * auVar90._8_4_ | (uint)!bVar8 * 0x60;
      tray.nearXYZ.field_0._28_4_ = (uint)bVar9 * auVar90._12_4_ | (uint)!bVar9 * 0x60;
      uVar77 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar95,5);
      auVar90 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar70 = (bool)((byte)uVar77 & 1);
      bVar7 = (bool)((byte)(uVar77 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar70 * auVar90._0_4_ | (uint)!bVar70 * 0xa0;
      tray.nearXYZ.field_0._36_4_ = (uint)bVar7 * auVar90._4_4_ | (uint)!bVar7 * 0xa0;
      tray.nearXYZ.field_0._40_4_ = (uint)bVar8 * auVar90._8_4_ | (uint)!bVar8 * 0xa0;
      tray.nearXYZ.field_0._44_4_ = (uint)bVar9 * auVar90._12_4_ | (uint)!bVar9 * 0xa0;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar180 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar90 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar95);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar88 & 1) * auVar90._0_4_ |
           (uint)!(bool)(bVar88 & 1) * stack_near[0].field_0._0_4_;
      bVar70 = (bool)((byte)(uVar89 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar70 * auVar90._4_4_ | (uint)!bVar70 * stack_near[0].field_0._4_4_;
      bVar70 = (bool)((byte)(uVar89 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar70 * auVar90._8_4_ | (uint)!bVar70 * stack_near[0].field_0._8_4_;
      bVar70 = SUB81(uVar89 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar70 * auVar90._12_4_ | (uint)!bVar70 * stack_near[0].field_0._12_4_;
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar179 = ZEXT1664(auVar90);
      auVar95 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar95);
      tray.tfar.field_0.i[0] =
           (uint)(bVar88 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar90._0_4_;
      bVar70 = (bool)((byte)(uVar89 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar70 * auVar95._4_4_ | (uint)!bVar70 * auVar90._4_4_;
      bVar70 = (bool)((byte)(uVar89 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar70 * auVar95._8_4_ | (uint)!bVar70 * auVar90._8_4_;
      bVar70 = SUB81(uVar89 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar70 * auVar95._12_4_ | (uint)!bVar70 * auVar90._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar77 = 3;
      }
      else {
        uVar77 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_3798 = ray + 0x80;
      local_3848 = (byte)((ushort)((short)uVar89 << 0xc) >> 0xc) ^ 0xf;
      pNVar86 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar87 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar90 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
      auVar181 = ZEXT1664(auVar90);
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar182 = ZEXT1664(auVar90);
      local_3790 = uVar77;
LAB_01d7cee1:
      do {
        bVar81 = (byte)local_3848;
        auVar90 = auVar179._0_16_;
        do {
          root.ptr = pNVar86[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01d7e34f;
          pNVar86 = pNVar86 + -1;
          vVar1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar87[-1].v;
          auVar174 = ZEXT1664((undefined1  [16])vVar1.field_0);
          paVar87 = paVar87 + -1;
          uVar89 = vcmpps_avx512vl((undefined1  [16])vVar1.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar89 == '\0');
        uVar84 = (undefined4)uVar89;
        bVar70 = uVar77 < (uint)POPCOUNT(uVar84);
        uVar77 = local_3790;
        if (bVar70) {
LAB_01d7cf38:
          do {
            bVar81 = (byte)local_3848;
            sVar79 = 8;
            auVar90 = auVar179._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01d7e34f;
              uVar10 = vcmpps_avx512vl(auVar174._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar10 == '\0') goto LAB_01d7cee1;
              bVar69 = ~bVar81 & 0xf;
              lVar73 = 0;
              goto LAB_01d7d16d;
            }
            uVar10 = vcmpps_avx512vl(auVar174._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar89 = root.ptr & 0xfffffffffffffff0;
            aVar121 = auVar180._0_16_;
            for (lVar73 = -0x20;
                (auVar174 = ZEXT1664((undefined1  [16])aVar121), lVar73 != 0 &&
                (sVar4 = *(size_t *)(uVar89 + 0x40 + lVar73 * 2), sVar4 != 8)); lVar73 = lVar73 + 4)
            {
              uVar84 = *(undefined4 *)(uVar89 + 0x120 + lVar73);
              auVar128._4_4_ = uVar84;
              auVar128._0_4_ = uVar84;
              auVar128._8_4_ = uVar84;
              auVar128._12_4_ = uVar84;
              auVar90 = *(undefined1 (*) [16])(ray + 0x70);
              uVar84 = *(undefined4 *)(uVar89 + 0x60 + lVar73);
              auVar13._4_4_ = uVar84;
              auVar13._0_4_ = uVar84;
              auVar13._8_4_ = uVar84;
              auVar13._12_4_ = uVar84;
              auVar95 = vfmadd213ps_avx512vl(auVar128,auVar90,auVar13);
              uVar84 = *(undefined4 *)(uVar89 + 0x160 + lVar73);
              auVar134._4_4_ = uVar84;
              auVar134._0_4_ = uVar84;
              auVar134._8_4_ = uVar84;
              auVar134._12_4_ = uVar84;
              uVar84 = *(undefined4 *)(uVar89 + 0xa0 + lVar73);
              auVar14._4_4_ = uVar84;
              auVar14._0_4_ = uVar84;
              auVar14._8_4_ = uVar84;
              auVar14._12_4_ = uVar84;
              auVar91 = vfmadd213ps_avx512vl(auVar134,auVar90,auVar14);
              uVar84 = *(undefined4 *)(uVar89 + 0x1a0 + lVar73);
              auVar141._4_4_ = uVar84;
              auVar141._0_4_ = uVar84;
              auVar141._8_4_ = uVar84;
              auVar141._12_4_ = uVar84;
              uVar84 = *(undefined4 *)(uVar89 + 0xe0 + lVar73);
              auVar15._4_4_ = uVar84;
              auVar15._0_4_ = uVar84;
              auVar15._8_4_ = uVar84;
              auVar15._12_4_ = uVar84;
              auVar94 = vfmadd213ps_avx512vl(auVar141,auVar90,auVar15);
              uVar84 = *(undefined4 *)(uVar89 + 0x140 + lVar73);
              auVar147._4_4_ = uVar84;
              auVar147._0_4_ = uVar84;
              auVar147._8_4_ = uVar84;
              auVar147._12_4_ = uVar84;
              uVar84 = *(undefined4 *)(uVar89 + 0x80 + lVar73);
              auVar16._4_4_ = uVar84;
              auVar16._0_4_ = uVar84;
              auVar16._8_4_ = uVar84;
              auVar16._12_4_ = uVar84;
              auVar96 = vfmadd213ps_avx512vl(auVar147,auVar90,auVar16);
              uVar84 = *(undefined4 *)(uVar89 + 0x180 + lVar73);
              auVar150._4_4_ = uVar84;
              auVar150._0_4_ = uVar84;
              auVar150._8_4_ = uVar84;
              auVar150._12_4_ = uVar84;
              uVar84 = *(undefined4 *)(uVar89 + 0xc0 + lVar73);
              auVar17._4_4_ = uVar84;
              auVar17._0_4_ = uVar84;
              auVar17._8_4_ = uVar84;
              auVar17._12_4_ = uVar84;
              auVar97 = vfmadd213ps_avx512vl(auVar150,auVar90,auVar17);
              uVar84 = *(undefined4 *)(uVar89 + 0x1c0 + lVar73);
              auVar153._4_4_ = uVar84;
              auVar153._0_4_ = uVar84;
              auVar153._8_4_ = uVar84;
              auVar153._12_4_ = uVar84;
              uVar84 = *(undefined4 *)(uVar89 + 0x100 + lVar73);
              auVar18._4_4_ = uVar84;
              auVar18._0_4_ = uVar84;
              auVar18._8_4_ = uVar84;
              auVar18._12_4_ = uVar84;
              auVar98 = vfmadd213ps_avx512vl(auVar153,auVar90,auVar18);
              auVar45._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar45._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar45._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar45._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar46._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar46._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar46._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar46._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar92 = vfmsub213ps_fma(auVar95,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar45);
              auVar93 = vfmsub213ps_fma(auVar91,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar46);
              auVar94 = vfmsub213ps_fma(auVar94,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,
                                        (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0);
              auVar96 = vfmsub213ps_fma(auVar96,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar45);
              auVar97 = vfmsub213ps_fma(auVar97,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar46);
              auVar98 = vfmsub213ps_fma(auVar98,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,
                                        (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0);
              auVar95 = vpminsd_avx(auVar92,auVar96);
              auVar91 = vpminsd_avx(auVar93,auVar97);
              auVar95 = vpmaxsd_avx(auVar95,auVar91);
              auVar91 = vpminsd_avx(auVar94,auVar98);
              auVar95 = vpmaxsd_avx(auVar95,auVar91);
              auVar91 = vpmaxsd_avx(auVar92,auVar96);
              auVar92 = vpmaxsd_avx(auVar93,auVar97);
              auVar92 = vpminsd_avx(auVar91,auVar92);
              auVar91 = vpmaxsd_avx(auVar94,auVar98);
              auVar92 = vpminsd_avx(auVar92,auVar91);
              auVar91 = vpmaxsd_avx(auVar95,(undefined1  [16])tray.tnear.field_0);
              auVar92 = vpminsd_avx(auVar92,(undefined1  [16])tray.tfar.field_0);
              uVar11 = vcmpps_avx512vl(auVar91,auVar92,2);
              bVar81 = (byte)uVar11;
              if (((uint)root.ptr & 7) == 6) {
                uVar84 = *(undefined4 *)(uVar89 + 0x200 + lVar73);
                auVar19._4_4_ = uVar84;
                auVar19._0_4_ = uVar84;
                auVar19._8_4_ = uVar84;
                auVar19._12_4_ = uVar84;
                uVar11 = vcmpps_avx512vl(auVar90,auVar19,1);
                uVar84 = *(undefined4 *)(uVar89 + 0x1e0 + lVar73);
                auVar20._4_4_ = uVar84;
                auVar20._0_4_ = uVar84;
                auVar20._8_4_ = uVar84;
                auVar20._12_4_ = uVar84;
                uVar12 = vcmpps_avx512vl(auVar90,auVar20,0xd);
                bVar81 = (byte)uVar11 & (byte)uVar12 & bVar81;
              }
              bVar81 = bVar81 & (byte)uVar10;
              sVar68 = sVar79;
              aVar99 = aVar121;
              if (bVar81 != 0) {
                auVar95 = vblendmps_avx512vl((undefined1  [16])auVar180._0_16_,auVar95);
                aVar99._0_4_ = (uint)(bVar81 & 1) * auVar95._0_4_ |
                               (uint)!(bool)(bVar81 & 1) * auVar90._0_4_;
                bVar70 = (bool)(bVar81 >> 1 & 1);
                aVar99._4_4_ = (uint)bVar70 * auVar95._4_4_ | (uint)!bVar70 * auVar90._4_4_;
                bVar70 = (bool)(bVar81 >> 2 & 1);
                aVar99._8_4_ = (uint)bVar70 * auVar95._8_4_ | (uint)!bVar70 * auVar90._8_4_;
                bVar70 = (bool)(bVar81 >> 3 & 1);
                aVar99._12_4_ = (uint)bVar70 * auVar95._12_4_ | (uint)!bVar70 * auVar90._12_4_;
                sVar68 = sVar4;
                if (sVar79 != 8) {
                  pNVar86->ptr = sVar79;
                  pNVar86 = pNVar86 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar87->v = aVar121;
                  paVar87 = paVar87 + 1;
                }
              }
              aVar121 = aVar99;
              sVar79 = sVar68;
            }
            if (sVar79 == 8) goto LAB_01d7d11e;
            uVar10 = vcmpps_avx512vl((undefined1  [16])aVar121,(undefined1  [16])tray.tfar.field_0,9
                                    );
            root.ptr = sVar79;
          } while ((byte)uVar77 < (byte)POPCOUNT((int)uVar10));
          pNVar86->ptr = sVar79;
          pNVar86 = pNVar86 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar87->v = aVar121;
          paVar87 = paVar87 + 1;
LAB_01d7d11e:
          iVar71 = 4;
        }
        else {
          while (bVar81 = (byte)local_3848, uVar89 != 0) {
            sVar79 = 0;
            for (uVar77 = uVar89; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
              sVar79 = sVar79 + 1;
            }
            uVar89 = uVar89 - 1 & uVar89;
            bVar70 = occluded1(This,bvh,root,sVar79,&pre,ray,&tray,context);
            bVar69 = (byte)(1 << ((uint)sVar79 & 0x1f));
            if (!bVar70) {
              bVar69 = 0;
            }
            local_3848 = (uint)(bVar81 | bVar69);
          }
          iVar71 = 3;
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar177 = ZEXT1664(auVar90);
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar178 = ZEXT1664(auVar90);
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar179 = ZEXT1664(auVar90);
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar180 = ZEXT1664(auVar90);
          auVar90 = vxorps_avx512vl(auVar181._0_16_,auVar181._0_16_);
          auVar181 = ZEXT1664(auVar90);
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar182 = ZEXT1664(auVar90);
          auVar174 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if (bVar81 != 0xf) {
            auVar90 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar81 & 1) * auVar90._0_4_ |
                 (uint)!(bool)(bVar81 & 1) * tray.tfar.field_0.i[0];
            bVar70 = (bool)((byte)(local_3848 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar70 * auVar90._4_4_ | (uint)!bVar70 * tray.tfar.field_0.i[1];
            bVar70 = (bool)((byte)(local_3848 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar70 * auVar90._8_4_ | (uint)!bVar70 * tray.tfar.field_0.i[2];
            bVar70 = (bool)((byte)(local_3848 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar70 * auVar90._12_4_ | (uint)!bVar70 * tray.tfar.field_0.i[3];
            iVar71 = 2;
          }
          uVar77 = local_3790;
          if (local_3790 < (uint)POPCOUNT(uVar84)) goto LAB_01d7cf38;
        }
        bVar81 = (byte)local_3848;
        auVar90 = auVar179._0_16_;
      } while (iVar71 != 3);
LAB_01d7e34f:
      bVar81 = bVar81 & bVar88;
      bVar70 = (bool)(bVar81 >> 1 & 1);
      bVar7 = (bool)(bVar81 >> 2 & 1);
      *(uint *)local_3798 =
           (uint)(bVar81 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar81 & 1) * *(int *)local_3798;
      *(uint *)(local_3798 + 4) =
           (uint)bVar70 * auVar90._4_4_ | (uint)!bVar70 * *(int *)(local_3798 + 4);
      *(uint *)(local_3798 + 8) =
           (uint)bVar7 * auVar90._8_4_ | (uint)!bVar7 * *(int *)(local_3798 + 8);
      *(uint *)(local_3798 + 0xc) =
           (uint)(bVar81 >> 3) * auVar90._12_4_ |
           (uint)!(bool)(bVar81 >> 3) * *(int *)(local_3798 + 0xc);
    }
  }
  return;
LAB_01d7d16d:
  do {
    if (lVar73 == (ulong)((uint)root.ptr & 0xf) - 8) goto LAB_01d7e1ee;
    lVar85 = lVar73 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    uVar89 = 0;
    uVar74 = (ulong)bVar69;
    for (uVar77 = uVar74; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
      uVar89 = uVar89 + 1;
    }
    lVar78 = 0;
    bVar83 = bVar69;
    do {
      auVar90 = auVar181._0_16_;
      if ((lVar78 == 4) || (*(int *)(lVar85 + 0x50 + lVar78 * 4) == -1)) goto LAB_01d7e1cb;
      pGVar5 = (context->scene->geometries).items[*(uint *)(lVar85 + 0x40 + lVar78 * 4)].ptr;
      fVar120 = (pGVar5->time_range).lower;
      auVar95._4_4_ = fVar120;
      auVar95._0_4_ = fVar120;
      auVar95._8_4_ = fVar120;
      auVar95._12_4_ = fVar120;
      fVar122 = pGVar5->fnumTimeSegments;
      auVar97._4_4_ = fVar122;
      auVar97._0_4_ = fVar122;
      auVar97._8_4_ = fVar122;
      auVar97._12_4_ = fVar122;
      auVar95 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar95);
      fVar120 = (pGVar5->time_range).upper - fVar120;
      auVar94._4_4_ = fVar120;
      auVar94._0_4_ = fVar120;
      auVar94._8_4_ = fVar120;
      auVar94._12_4_ = fVar120;
      auVar95 = vdivps_avx(auVar95,auVar94);
      auVar96._0_4_ = fVar122 * auVar95._0_4_;
      auVar96._4_4_ = fVar122 * auVar95._4_4_;
      auVar96._8_4_ = fVar122 * auVar95._8_4_;
      auVar96._12_4_ = fVar122 * auVar95._12_4_;
      auVar95 = vroundps_avx(auVar96,1);
      auVar91 = vaddss_avx512f(auVar97,SUB6416(ZEXT464(0xbf800000),0));
      auVar98._0_4_ = auVar91._0_4_;
      auVar98._4_4_ = auVar98._0_4_;
      auVar98._8_4_ = auVar98._0_4_;
      auVar98._12_4_ = auVar98._0_4_;
      auVar95 = vminps_avx(auVar95,auVar98);
      auVar95 = vmaxps_avx512vl(auVar95,auVar90);
      itime.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar95);
      auVar95 = vsubps_avx(auVar96,auVar95);
      auVar91 = vpbroadcastd_avx512vl();
      uVar10 = vpcmpeqd_avx512vl(auVar91,(undefined1  [16])itime.field_0);
      uVar72 = uVar74;
      uVar77 = uVar89;
      if ((byte)((byte)uVar10 & 0xf | bVar69 ^ 0xf) == 0xf) {
        lVar75 = (long)itime.field_0.i[uVar89] * 0x38;
        lVar76 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar75);
        lVar75 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar75);
        uVar77 = (ulong)*(uint *)(lVar85 + lVar78 * 4);
        uVar72 = (ulong)*(uint *)(lVar85 + 0x10 + lVar78 * 4);
        auVar98 = vsubps_avx512vl(auVar178._0_16_,auVar95);
        uVar84 = *(undefined4 *)(lVar75 + uVar77 * 4);
        auVar21._4_4_ = uVar84;
        auVar21._0_4_ = uVar84;
        auVar21._8_4_ = uVar84;
        auVar21._12_4_ = uVar84;
        auVar91 = vmulps_avx512vl(auVar95,auVar21);
        uVar84 = *(undefined4 *)(lVar75 + 4 + uVar77 * 4);
        auVar22._4_4_ = uVar84;
        auVar22._0_4_ = uVar84;
        auVar22._8_4_ = uVar84;
        auVar22._12_4_ = uVar84;
        auVar92 = vmulps_avx512vl(auVar95,auVar22);
        uVar84 = *(undefined4 *)(lVar75 + 8 + uVar77 * 4);
        auVar23._4_4_ = uVar84;
        auVar23._0_4_ = uVar84;
        auVar23._8_4_ = uVar84;
        auVar23._12_4_ = uVar84;
        auVar93 = vmulps_avx512vl(auVar95,auVar23);
        uVar84 = *(undefined4 *)(lVar76 + uVar77 * 4);
        auVar24._4_4_ = uVar84;
        auVar24._0_4_ = uVar84;
        auVar24._8_4_ = uVar84;
        auVar24._12_4_ = uVar84;
        auVar100 = vfmadd231ps_avx512vl(auVar91,auVar98,auVar24);
        uVar84 = *(undefined4 *)(lVar76 + 4 + uVar77 * 4);
        auVar25._4_4_ = uVar84;
        auVar25._0_4_ = uVar84;
        auVar25._8_4_ = uVar84;
        auVar25._12_4_ = uVar84;
        auVar101 = vfmadd231ps_avx512vl(auVar92,auVar98,auVar25);
        uVar84 = *(undefined4 *)(lVar76 + 8 + uVar77 * 4);
        auVar26._4_4_ = uVar84;
        auVar26._0_4_ = uVar84;
        auVar26._8_4_ = uVar84;
        auVar26._12_4_ = uVar84;
        auVar102 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar26);
        uVar84 = *(undefined4 *)(lVar75 + uVar72 * 4);
        auVar27._4_4_ = uVar84;
        auVar27._0_4_ = uVar84;
        auVar27._8_4_ = uVar84;
        auVar27._12_4_ = uVar84;
        auVar91 = vmulps_avx512vl(auVar95,auVar27);
        uVar84 = *(undefined4 *)(lVar75 + 4 + uVar72 * 4);
        auVar28._4_4_ = uVar84;
        auVar28._0_4_ = uVar84;
        auVar28._8_4_ = uVar84;
        auVar28._12_4_ = uVar84;
        auVar92 = vmulps_avx512vl(auVar95,auVar28);
        uVar84 = *(undefined4 *)(lVar75 + 8 + uVar72 * 4);
        auVar29._4_4_ = uVar84;
        auVar29._0_4_ = uVar84;
        auVar29._8_4_ = uVar84;
        auVar29._12_4_ = uVar84;
        auVar94 = vmulps_avx512vl(auVar95,auVar29);
        uVar84 = *(undefined4 *)(lVar76 + uVar72 * 4);
        auVar30._4_4_ = uVar84;
        auVar30._0_4_ = uVar84;
        auVar30._8_4_ = uVar84;
        auVar30._12_4_ = uVar84;
        auVar93 = vfmadd231ps_avx512vl(auVar91,auVar98,auVar30);
        uVar84 = *(undefined4 *)(lVar76 + 4 + uVar72 * 4);
        auVar31._4_4_ = uVar84;
        auVar31._0_4_ = uVar84;
        auVar31._8_4_ = uVar84;
        auVar31._12_4_ = uVar84;
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar98,auVar31);
        uVar84 = *(undefined4 *)(lVar76 + 8 + uVar72 * 4);
        auVar32._4_4_ = uVar84;
        auVar32._0_4_ = uVar84;
        auVar32._8_4_ = uVar84;
        auVar32._12_4_ = uVar84;
        auVar97 = vfmadd231ps_avx512vl(auVar94,auVar98,auVar32);
        uVar77 = (ulong)*(uint *)(lVar85 + 0x20 + lVar78 * 4);
        uVar84 = *(undefined4 *)(lVar75 + uVar77 * 4);
        auVar33._4_4_ = uVar84;
        auVar33._0_4_ = uVar84;
        auVar33._8_4_ = uVar84;
        auVar33._12_4_ = uVar84;
        auVar92 = vmulps_avx512vl(auVar95,auVar33);
        uVar84 = *(undefined4 *)(lVar75 + 4 + uVar77 * 4);
        auVar34._4_4_ = uVar84;
        auVar34._0_4_ = uVar84;
        auVar34._8_4_ = uVar84;
        auVar34._12_4_ = uVar84;
        auVar96 = vmulps_avx512vl(auVar95,auVar34);
        uVar84 = *(undefined4 *)(lVar75 + 8 + uVar77 * 4);
        auVar35._4_4_ = uVar84;
        auVar35._0_4_ = uVar84;
        auVar35._8_4_ = uVar84;
        auVar35._12_4_ = uVar84;
        auVar103 = vmulps_avx512vl(auVar95,auVar35);
        uVar84 = *(undefined4 *)(lVar76 + uVar77 * 4);
        auVar36._4_4_ = uVar84;
        auVar36._0_4_ = uVar84;
        auVar36._8_4_ = uVar84;
        auVar36._12_4_ = uVar84;
        auVar94 = vfmadd231ps_avx512vl(auVar92,auVar98,auVar36);
        uVar84 = *(undefined4 *)(lVar76 + 4 + uVar77 * 4);
        auVar37._4_4_ = uVar84;
        auVar37._0_4_ = uVar84;
        auVar37._8_4_ = uVar84;
        auVar37._12_4_ = uVar84;
        auVar92 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar37);
        uVar84 = *(undefined4 *)(lVar76 + 8 + uVar77 * 4);
        auVar38._4_4_ = uVar84;
        auVar38._0_4_ = uVar84;
        auVar38._8_4_ = uVar84;
        auVar38._12_4_ = uVar84;
        auVar96 = vfmadd231ps_avx512vl(auVar103,auVar98,auVar38);
        uVar77 = (ulong)*(uint *)(lVar85 + 0x30 + lVar78 * 4);
        uVar84 = *(undefined4 *)(lVar75 + uVar77 * 4);
        auVar39._4_4_ = uVar84;
        auVar39._0_4_ = uVar84;
        auVar39._8_4_ = uVar84;
        auVar39._12_4_ = uVar84;
        auVar103 = vmulps_avx512vl(auVar95,auVar39);
        uVar84 = *(undefined4 *)(lVar75 + 4 + uVar77 * 4);
        auVar40._4_4_ = uVar84;
        auVar40._0_4_ = uVar84;
        auVar40._8_4_ = uVar84;
        auVar40._12_4_ = uVar84;
        auVar104 = vmulps_avx512vl(auVar95,auVar40);
        uVar84 = *(undefined4 *)(lVar75 + 8 + uVar77 * 4);
        auVar41._4_4_ = uVar84;
        auVar41._0_4_ = uVar84;
        auVar41._8_4_ = uVar84;
        auVar41._12_4_ = uVar84;
        auVar105 = vmulps_avx512vl(auVar95,auVar41);
        uVar84 = *(undefined4 *)(lVar76 + uVar77 * 4);
        auVar42._4_4_ = uVar84;
        auVar42._0_4_ = uVar84;
        auVar42._8_4_ = uVar84;
        auVar42._12_4_ = uVar84;
        auVar95 = vfmadd231ps_avx512vl(auVar103,auVar98,auVar42);
        uVar84 = *(undefined4 *)(lVar76 + 4 + uVar77 * 4);
        auVar43._4_4_ = uVar84;
        auVar43._0_4_ = uVar84;
        auVar43._8_4_ = uVar84;
        auVar43._12_4_ = uVar84;
        auVar106 = vfmadd231ps_avx512vl(auVar104,auVar98,auVar43);
        uVar84 = *(undefined4 *)(lVar76 + 8 + uVar77 * 4);
        auVar44._4_4_ = uVar84;
        auVar44._0_4_ = uVar84;
        auVar44._8_4_ = uVar84;
        auVar44._12_4_ = uVar84;
        auVar107 = vfmadd231ps_avx512vl(auVar105,auVar98,auVar44);
      }
      else {
        while (uVar72 != 0) {
          lVar76 = (long)itime.field_0.i[uVar77] * 0x38;
          uVar80 = (ulong)*(uint *)(lVar85 + lVar78 * 4);
          auVar91 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + lVar76) + uVar80 * 4);
          auVar92 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar76) + uVar80 * 4);
          *(int *)((long)&p0.field_0 + uVar77 * 4) = auVar91._0_4_;
          uVar84 = vextractps_avx(auVar91,1);
          *(undefined4 *)((long)&p0.field_0 + uVar77 * 4 + 0x10) = uVar84;
          uVar84 = vextractps_avx(auVar91,2);
          *(undefined4 *)((long)&p0.field_0 + uVar77 * 4 + 0x20) = uVar84;
          *(int *)((long)&p1.field_0 + uVar77 * 4) = auVar92._0_4_;
          uVar84 = vextractps_avx(auVar92,1);
          *(undefined4 *)((long)&p1.field_0 + uVar77 * 4 + 0x10) = uVar84;
          uVar84 = vextractps_avx(auVar92,2);
          *(undefined4 *)((long)&p1.field_0 + uVar77 * 4 + 0x20) = uVar84;
          uVar80 = uVar77 & 0x3f;
          uVar77 = 0;
          uVar72 = uVar72 ^ 1L << uVar80;
          for (uVar80 = uVar72; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
            uVar77 = uVar77 + 1;
          }
        }
        auVar91 = vsubps_avx512vl(auVar178._0_16_,auVar95);
        uVar53 = p0.field_0._0_4_;
        uVar54 = p0.field_0._4_4_;
        uVar56 = p0.field_0._8_4_;
        uVar58 = p0.field_0._12_4_;
        uVar60 = p0.field_0._32_4_;
        uVar62 = p0.field_0._36_4_;
        uVar64 = p0.field_0._40_4_;
        uVar66 = p0.field_0._44_4_;
        fVar133 = auVar91._0_4_;
        fVar137 = auVar91._4_4_;
        fVar138 = auVar91._8_4_;
        fVar139 = auVar91._12_4_;
        uVar84 = p1.field_0._0_4_;
        uVar47 = p1.field_0._4_4_;
        uVar49 = p1.field_0._8_4_;
        uVar51 = p1.field_0._12_4_;
        fVar120 = auVar95._0_4_;
        fVar122 = auVar95._4_4_;
        fVar123 = auVar95._8_4_;
        fVar124 = auVar95._12_4_;
        auVar101._0_4_ = fVar133 * (float)p0.field_0._16_4_ + fVar120 * (float)p1.field_0._16_4_;
        auVar101._4_4_ = fVar137 * (float)p0.field_0._20_4_ + fVar122 * (float)p1.field_0._20_4_;
        auVar101._8_4_ = fVar138 * (float)p0.field_0._24_4_ + fVar123 * (float)p1.field_0._24_4_;
        auVar101._12_4_ = fVar139 * (float)p0.field_0._28_4_ + fVar124 * (float)p1.field_0._28_4_;
        fVar140 = fVar120 * (float)p1.field_0._32_4_;
        fVar144 = fVar122 * (float)p1.field_0._36_4_;
        fVar145 = fVar123 * (float)p1.field_0._40_4_;
        fVar146 = fVar124 * (float)p1.field_0._44_4_;
        uVar72 = uVar74;
        uVar77 = uVar89;
        while (uVar72 != 0) {
          lVar76 = (long)itime.field_0.i[uVar77] * 0x38;
          uVar80 = (ulong)*(uint *)(lVar85 + 0x10 + lVar78 * 4);
          auVar95 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + lVar76) + uVar80 * 4);
          auVar91 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar76) + uVar80 * 4);
          *(int *)((long)&p0.field_0 + uVar77 * 4) = auVar95._0_4_;
          uVar2 = vextractps_avx(auVar95,1);
          *(undefined4 *)((long)&p0.field_0 + uVar77 * 4 + 0x10) = uVar2;
          uVar2 = vextractps_avx(auVar95,2);
          *(undefined4 *)((long)&p0.field_0 + uVar77 * 4 + 0x20) = uVar2;
          *(int *)((long)&p1.field_0 + uVar77 * 4) = auVar91._0_4_;
          uVar2 = vextractps_avx(auVar91,1);
          *(undefined4 *)((long)&p1.field_0 + uVar77 * 4 + 0x10) = uVar2;
          uVar2 = vextractps_avx(auVar91,2);
          *(undefined4 *)((long)&p1.field_0 + uVar77 * 4 + 0x20) = uVar2;
          uVar80 = uVar77 & 0x3f;
          uVar77 = 0;
          uVar72 = uVar72 ^ 1L << uVar80;
          for (uVar80 = uVar72; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
            uVar77 = uVar77 + 1;
          }
        }
        uVar3 = p0.field_0._0_4_;
        uVar55 = p0.field_0._4_4_;
        uVar57 = p0.field_0._8_4_;
        uVar59 = p0.field_0._12_4_;
        uVar61 = p0.field_0._32_4_;
        uVar63 = p0.field_0._36_4_;
        uVar65 = p0.field_0._40_4_;
        uVar67 = p0.field_0._44_4_;
        auVar105._0_4_ = fVar133 * (float)p0.field_0._16_4_;
        auVar105._4_4_ = fVar137 * (float)p0.field_0._20_4_;
        auVar105._8_4_ = fVar138 * (float)p0.field_0._24_4_;
        auVar105._12_4_ = fVar139 * (float)p0.field_0._28_4_;
        uVar2 = p1.field_0._0_4_;
        uVar48 = p1.field_0._4_4_;
        uVar50 = p1.field_0._8_4_;
        uVar52 = p1.field_0._12_4_;
        auVar100._0_4_ = fVar133 * (float)uVar53 + fVar120 * (float)uVar84;
        auVar100._4_4_ = fVar137 * (float)uVar54 + fVar122 * (float)uVar47;
        auVar100._8_4_ = fVar138 * (float)uVar56 + fVar123 * (float)uVar49;
        auVar100._12_4_ = fVar139 * (float)uVar58 + fVar124 * (float)uVar51;
        auVar103._0_4_ = fVar120 * (float)p1.field_0._16_4_;
        auVar103._4_4_ = fVar122 * (float)p1.field_0._20_4_;
        auVar103._8_4_ = fVar123 * (float)p1.field_0._24_4_;
        auVar103._12_4_ = fVar124 * (float)p1.field_0._28_4_;
        auVar91 = vaddps_avx512vl(auVar105,auVar103);
        auVar104._0_4_ = fVar120 * (float)p1.field_0._32_4_;
        auVar104._4_4_ = fVar122 * (float)p1.field_0._36_4_;
        auVar104._8_4_ = fVar123 * (float)p1.field_0._40_4_;
        auVar104._12_4_ = fVar124 * (float)p1.field_0._44_4_;
        uVar72 = uVar74;
        uVar77 = uVar89;
        while (uVar72 != 0) {
          lVar76 = (long)itime.field_0.i[uVar77] * 0x38;
          uVar80 = (ulong)*(uint *)(lVar85 + 0x20 + lVar78 * 4);
          auVar95 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + lVar76) + uVar80 * 4);
          auVar92 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar76) + uVar80 * 4);
          *(int *)((long)&p0.field_0 + uVar77 * 4) = auVar95._0_4_;
          uVar84 = vextractps_avx(auVar95,1);
          *(undefined4 *)((long)&p0.field_0 + uVar77 * 4 + 0x10) = uVar84;
          uVar84 = vextractps_avx(auVar95,2);
          *(undefined4 *)((long)&p0.field_0 + uVar77 * 4 + 0x20) = uVar84;
          *(int *)((long)&p1.field_0 + uVar77 * 4) = auVar92._0_4_;
          uVar84 = vextractps_avx(auVar92,1);
          *(undefined4 *)((long)&p1.field_0 + uVar77 * 4 + 0x10) = uVar84;
          uVar84 = vextractps_avx(auVar92,2);
          *(undefined4 *)((long)&p1.field_0 + uVar77 * 4 + 0x20) = uVar84;
          uVar80 = uVar77 & 0x3f;
          uVar77 = 0;
          uVar72 = uVar72 ^ 1L << uVar80;
          for (uVar80 = uVar72; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
            uVar77 = uVar77 + 1;
          }
        }
        auVar116._0_4_ = (float)uVar3 * fVar133;
        auVar116._4_4_ = (float)uVar55 * fVar137;
        auVar116._8_4_ = (float)uVar57 * fVar138;
        auVar116._12_4_ = (float)uVar59 * fVar139;
        auVar168._0_4_ = (float)uVar2 * fVar120;
        auVar168._4_4_ = (float)uVar48 * fVar122;
        auVar168._8_4_ = (float)uVar50 * fVar123;
        auVar168._12_4_ = (float)uVar52 * fVar124;
        uVar53 = p0.field_0._0_4_;
        uVar54 = p0.field_0._4_4_;
        uVar56 = p0.field_0._8_4_;
        uVar58 = p0.field_0._12_4_;
        uVar2 = p0.field_0._32_4_;
        uVar48 = p0.field_0._36_4_;
        uVar50 = p0.field_0._40_4_;
        uVar52 = p0.field_0._44_4_;
        auVar108._0_4_ = fVar133 * (float)p0.field_0._16_4_;
        auVar108._4_4_ = fVar137 * (float)p0.field_0._20_4_;
        auVar108._8_4_ = fVar138 * (float)p0.field_0._24_4_;
        auVar108._12_4_ = fVar139 * (float)p0.field_0._28_4_;
        uVar84 = p1.field_0._0_4_;
        uVar47 = p1.field_0._4_4_;
        uVar49 = p1.field_0._8_4_;
        uVar51 = p1.field_0._12_4_;
        auVar93 = vaddps_avx512vl(auVar116,auVar168);
        auVar117._0_4_ = fVar120 * (float)p1.field_0._16_4_;
        auVar117._4_4_ = fVar122 * (float)p1.field_0._20_4_;
        auVar117._8_4_ = fVar123 * (float)p1.field_0._24_4_;
        auVar117._12_4_ = fVar124 * (float)p1.field_0._28_4_;
        auVar92 = vaddps_avx512vl(auVar108,auVar117);
        auVar118._0_4_ = fVar120 * (float)p1.field_0._32_4_;
        auVar118._4_4_ = fVar122 * (float)p1.field_0._36_4_;
        auVar118._8_4_ = fVar123 * (float)p1.field_0._40_4_;
        auVar118._12_4_ = fVar124 * (float)p1.field_0._44_4_;
        uVar72 = uVar74;
        uVar77 = uVar89;
        while (uVar72 != 0) {
          lVar76 = (long)itime.field_0.i[uVar77] * 0x38;
          uVar80 = (ulong)*(uint *)(lVar85 + 0x30 + lVar78 * 4);
          auVar95 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + lVar76) + uVar80 * 4);
          auVar94 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar76) + uVar80 * 4);
          *(int *)((long)&p0.field_0 + uVar77 * 4) = auVar95._0_4_;
          uVar3 = vextractps_avx(auVar95,1);
          *(undefined4 *)((long)&p0.field_0 + uVar77 * 4 + 0x10) = uVar3;
          uVar3 = vextractps_avx(auVar95,2);
          *(undefined4 *)((long)&p0.field_0 + uVar77 * 4 + 0x20) = uVar3;
          *(int *)((long)&p1.field_0 + uVar77 * 4) = auVar94._0_4_;
          uVar3 = vextractps_avx(auVar94,1);
          *(undefined4 *)((long)&p1.field_0 + uVar77 * 4 + 0x10) = uVar3;
          uVar3 = vextractps_avx(auVar94,2);
          *(undefined4 *)((long)&p1.field_0 + uVar77 * 4 + 0x20) = uVar3;
          uVar80 = uVar77 & 0x3f;
          uVar77 = 0;
          uVar72 = uVar72 ^ 1L << uVar80;
          for (uVar80 = uVar72; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
            uVar77 = uVar77 + 1;
          }
        }
        auVar102._0_4_ = fVar133 * (float)uVar60 + fVar140;
        auVar102._4_4_ = fVar137 * (float)uVar62 + fVar144;
        auVar102._8_4_ = fVar138 * (float)uVar64 + fVar145;
        auVar102._12_4_ = fVar139 * (float)uVar66 + fVar146;
        auVar109._0_4_ = fVar133 * (float)uVar61;
        auVar109._4_4_ = fVar137 * (float)uVar63;
        auVar109._8_4_ = fVar138 * (float)uVar65;
        auVar109._12_4_ = fVar139 * (float)uVar67;
        auVar97 = vaddps_avx512vl(auVar109,auVar104);
        auVar110._0_4_ = (float)uVar53 * fVar133;
        auVar110._4_4_ = (float)uVar54 * fVar137;
        auVar110._8_4_ = (float)uVar56 * fVar138;
        auVar110._12_4_ = (float)uVar58 * fVar139;
        auVar112._0_4_ = (float)uVar2 * fVar133;
        auVar112._4_4_ = (float)uVar48 * fVar137;
        auVar112._8_4_ = (float)uVar50 * fVar138;
        auVar112._12_4_ = (float)uVar52 * fVar139;
        auVar96 = vaddps_avx512vl(auVar112,auVar118);
        auVar113._0_4_ = (float)uVar84 * fVar120;
        auVar113._4_4_ = (float)uVar47 * fVar122;
        auVar113._8_4_ = (float)uVar49 * fVar123;
        auVar113._12_4_ = (float)uVar51 * fVar124;
        auVar155._0_4_ = fVar133 * (float)p0.field_0._0_4_;
        auVar155._4_4_ = fVar137 * (float)p0.field_0._4_4_;
        auVar155._8_4_ = fVar138 * (float)p0.field_0._8_4_;
        auVar155._12_4_ = fVar139 * (float)p0.field_0._12_4_;
        auVar94 = vaddps_avx512vl(auVar110,auVar113);
        auVar111._0_4_ = fVar120 * (float)p1.field_0._0_4_;
        auVar111._4_4_ = fVar122 * (float)p1.field_0._4_4_;
        auVar111._8_4_ = fVar123 * (float)p1.field_0._8_4_;
        auVar111._12_4_ = fVar124 * (float)p1.field_0._12_4_;
        auVar95 = vaddps_avx512vl(auVar155,auVar111);
        auVar106._0_4_ = fVar133 * (float)p0.field_0._16_4_ + fVar120 * (float)p1.field_0._16_4_;
        auVar106._4_4_ = fVar137 * (float)p0.field_0._20_4_ + fVar122 * (float)p1.field_0._20_4_;
        auVar106._8_4_ = fVar138 * (float)p0.field_0._24_4_ + fVar123 * (float)p1.field_0._24_4_;
        auVar106._12_4_ = fVar139 * (float)p0.field_0._28_4_ + fVar124 * (float)p1.field_0._28_4_;
        auVar107._0_4_ = fVar133 * (float)p0.field_0._32_4_ + fVar120 * (float)p1.field_0._32_4_;
        auVar107._4_4_ = fVar137 * (float)p0.field_0._36_4_ + fVar122 * (float)p1.field_0._36_4_;
        auVar107._8_4_ = fVar138 * (float)p0.field_0._40_4_ + fVar123 * (float)p1.field_0._40_4_;
        auVar107._12_4_ = fVar139 * (float)p0.field_0._44_4_ + fVar124 * (float)p1.field_0._44_4_;
      }
      auVar108 = vsubps_avx512vl(auVar100,auVar93);
      auVar109 = vsubps_avx512vl(auVar101,auVar91);
      auVar110 = vsubps_avx512vl(auVar102,auVar97);
      auVar111 = vsubps_avx512vl(auVar95,auVar100);
      auVar112 = vsubps_avx512vl(auVar106,auVar101);
      auVar113 = vsubps_avx512vl(auVar107,auVar102);
      auVar98 = vmulps_avx512vl(auVar109,auVar113);
      vVar114.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmsub231ps_avx512vl(auVar98,auVar112,auVar110);
      auVar135._0_4_ = auVar110._0_4_ * auVar111._0_4_;
      auVar135._4_4_ = auVar110._4_4_ * auVar111._4_4_;
      auVar135._8_4_ = auVar110._8_4_ * auVar111._8_4_;
      auVar135._12_4_ = auVar110._12_4_ * auVar111._12_4_;
      vVar115.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmsub231ps_avx512vl(auVar135,auVar113,auVar108);
      auVar98 = vmulps_avx512vl(auVar108,auVar112);
      auVar116 = vfmsub231ps_fma(auVar98,auVar111,auVar109);
      auVar103 = vsubps_avx(auVar100,*(undefined1 (*) [16])ray);
      auVar104 = vsubps_avx(auVar101,*(undefined1 (*) [16])(ray + 0x10));
      auVar105 = vsubps_avx(auVar102,*(undefined1 (*) [16])(ray + 0x20));
      auVar98 = *(undefined1 (*) [16])(ray + 0x40);
      auVar101 = *(undefined1 (*) [16])(ray + 0x50);
      auVar100 = *(undefined1 (*) [16])(ray + 0x60);
      auVar129._0_4_ = auVar101._0_4_ * auVar105._0_4_;
      auVar129._4_4_ = auVar101._4_4_ * auVar105._4_4_;
      auVar129._8_4_ = auVar101._8_4_ * auVar105._8_4_;
      auVar129._12_4_ = auVar101._12_4_ * auVar105._12_4_;
      auVar117 = vfmsub231ps_fma(auVar129,auVar104,auVar100);
      auVar172._0_4_ = auVar100._0_4_ * auVar103._0_4_;
      auVar172._4_4_ = auVar100._4_4_ * auVar103._4_4_;
      auVar172._8_4_ = auVar100._8_4_ * auVar103._8_4_;
      auVar172._12_4_ = auVar100._12_4_ * auVar103._12_4_;
      auVar118 = vfmsub231ps_fma(auVar172,auVar105,auVar98);
      auVar175._0_4_ = auVar98._0_4_ * auVar104._0_4_;
      auVar175._4_4_ = auVar98._4_4_ * auVar104._4_4_;
      auVar175._8_4_ = auVar98._8_4_ * auVar104._8_4_;
      auVar175._12_4_ = auVar98._12_4_ * auVar104._12_4_;
      auVar168 = vfmsub231ps_fma(auVar175,auVar103,auVar101);
      auVar148._0_4_ = auVar116._0_4_ * auVar100._0_4_;
      auVar148._4_4_ = auVar116._4_4_ * auVar100._4_4_;
      auVar148._8_4_ = auVar116._8_4_ * auVar100._8_4_;
      auVar148._12_4_ = auVar116._12_4_ * auVar100._12_4_;
      auVar101 = vfmadd231ps_fma(auVar148,(undefined1  [16])vVar115.field_0,auVar101);
      auVar98 = vfmadd231ps_fma(auVar101,(undefined1  [16])vVar114.field_0,auVar98);
      auVar100 = vandps_avx512vl(auVar98,auVar182._0_16_);
      auVar101 = vmulps_avx512vl(auVar113,auVar168);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar118,auVar112);
      auVar101 = vfmadd231ps_fma(auVar101,auVar117,auVar111);
      uVar167 = auVar100._0_4_;
      auVar125._0_4_ = (float)(uVar167 ^ auVar101._0_4_);
      uVar169 = auVar100._4_4_;
      auVar125._4_4_ = (float)(uVar169 ^ auVar101._4_4_);
      uVar170 = auVar100._8_4_;
      auVar125._8_4_ = (float)(uVar170 ^ auVar101._8_4_);
      uVar171 = auVar100._12_4_;
      auVar125._12_4_ = (float)(uVar171 ^ auVar101._12_4_);
      uVar10 = vcmpps_avx512vl(auVar125,auVar90,5);
      bVar82 = (byte)uVar10 & bVar83;
      if (bVar82 != 0) {
        auVar166._0_4_ = auVar110._0_4_ * auVar168._0_4_;
        auVar166._4_4_ = auVar110._4_4_ * auVar168._4_4_;
        auVar166._8_4_ = auVar110._8_4_ * auVar168._8_4_;
        auVar166._12_4_ = auVar110._12_4_ * auVar168._12_4_;
        auVar101 = vfmadd213ps_fma(auVar109,auVar118,auVar166);
        auVar101 = vfmadd213ps_fma(auVar108,auVar117,auVar101);
        auVar131._0_4_ = (float)(uVar167 ^ auVar101._0_4_);
        auVar131._4_4_ = (float)(uVar169 ^ auVar101._4_4_);
        auVar131._8_4_ = (float)(uVar170 ^ auVar101._8_4_);
        auVar131._12_4_ = (float)(uVar171 ^ auVar101._12_4_);
        uVar10 = vcmpps_avx512vl(auVar131,auVar90,5);
        bVar82 = bVar82 & (byte)uVar10;
        if (bVar82 != 0) {
          auVar100 = vandps_avx512vl(auVar98,auVar177._0_16_);
          auVar101 = vsubps_avx(auVar100,auVar125);
          uVar10 = vcmpps_avx512vl(auVar101,auVar131,5);
          bVar82 = bVar82 & (byte)uVar10;
          if (bVar82 != 0) {
            auVar161._0_4_ = auVar105._0_4_ * auVar116._0_4_;
            auVar161._4_4_ = auVar105._4_4_ * auVar116._4_4_;
            auVar161._8_4_ = auVar105._8_4_ * auVar116._8_4_;
            auVar161._12_4_ = auVar105._12_4_ * auVar116._12_4_;
            auVar101 = vfmadd213ps_fma(auVar104,(undefined1  [16])vVar115.field_0,auVar161);
            auVar101 = vfmadd213ps_fma(auVar103,(undefined1  [16])vVar114.field_0,auVar101);
            auVar154._0_4_ = auVar100._0_4_ * *(float *)(ray + 0x30);
            auVar154._4_4_ = auVar100._4_4_ * *(float *)(ray + 0x34);
            auVar154._8_4_ = auVar100._8_4_ * *(float *)(ray + 0x38);
            auVar154._12_4_ = auVar100._12_4_ * *(float *)(ray + 0x3c);
            auVar151._0_4_ = uVar167 ^ auVar101._0_4_;
            auVar151._4_4_ = uVar169 ^ auVar101._4_4_;
            auVar151._8_4_ = uVar170 ^ auVar101._8_4_;
            auVar151._12_4_ = uVar171 ^ auVar101._12_4_;
            auVar162._0_4_ = auVar100._0_4_ * *(float *)(ray + 0x80);
            auVar162._4_4_ = auVar100._4_4_ * *(float *)(ray + 0x84);
            auVar162._8_4_ = auVar100._8_4_ * *(float *)(ray + 0x88);
            auVar162._12_4_ = auVar100._12_4_ * *(float *)(ray + 0x8c);
            uVar10 = vcmpps_avx512vl(auVar151,auVar162,2);
            uVar11 = vcmpps_avx512vl(auVar154,auVar151,1);
            bVar82 = bVar82 & (byte)uVar10 & (byte)uVar11;
            if (bVar82 == 0) {
LAB_01d7dbe9:
              auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar90 = vxorps_avx512vl(auVar90,auVar90);
              auVar104 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            }
            else {
              uVar10 = vcmpps_avx512vl(auVar98,ZEXT816(0) << 0x20,4);
              bVar82 = bVar82 & (byte)uVar10;
              if (bVar82 == 0) goto LAB_01d7dbe9;
              uVar167 = pGVar5->mask;
              auVar149._4_4_ = uVar167;
              auVar149._0_4_ = uVar167;
              auVar149._8_4_ = uVar167;
              auVar149._12_4_ = uVar167;
              uVar10 = vptestmd_avx512vl(auVar149,*(undefined1 (*) [16])(ray + 0x90));
              bVar82 = bVar82 & (byte)uVar10 & 0xf;
              uVar77 = (ulong)bVar82;
              if (bVar82 == 0) goto LAB_01d7dbe9;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar101 = vrcp14ps_avx512vl(auVar100);
                auVar158._8_4_ = 0x3f800000;
                auVar158._0_8_ = 0x3f8000003f800000;
                auVar158._12_4_ = 0x3f800000;
                auVar98 = vfnmadd213ps_fma(auVar100,auVar101,auVar158);
                auVar98 = vfmadd132ps_fma(auVar98,auVar101,auVar101);
                auVar127._0_4_ = auVar98._0_4_ * auVar125._0_4_;
                auVar127._4_4_ = auVar98._4_4_ * auVar125._4_4_;
                auVar127._8_4_ = auVar98._8_4_ * auVar125._8_4_;
                auVar127._12_4_ = auVar98._12_4_ * auVar125._12_4_;
                vminps_avx(auVar127,auVar158);
                auVar132._0_4_ = auVar98._0_4_ * auVar131._0_4_;
                auVar132._4_4_ = auVar98._4_4_ * auVar131._4_4_;
                auVar132._8_4_ = auVar98._8_4_ * auVar131._8_4_;
                auVar132._12_4_ = auVar98._12_4_ * auVar131._12_4_;
                vminps_avx(auVar132,auVar158);
                p1.field_0._0_8_ = &itime;
                p1.field_0._8_8_ = &t;
                p1.field_0._16_8_ = &v_1;
                p1.field_0._24_8_ = &u;
                p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar114.field_0;
                p0.field_0.field_0.y.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar115.field_0;
                p0.field_0._32_16_ = auVar116;
                std::
                _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                ::
                _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                          ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                            *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                   *)&p0);
                auVar98 = vpbroadcastd_avx512vl();
                vpbroadcastd_avx512vl();
                p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)itime.field_0;
                p0.field_0._24_8_ = uStack_3640;
                p0.field_0._16_8_ = local_3648;
                p0.field_0._40_8_ = uStack_3630;
                p0.field_0._32_8_ = uStack_3638;
                vpcmpeqd_avx2(ZEXT1632(auVar98),ZEXT1632(auVar98));
                auVar98 = *(undefined1 (*) [16])(ray + 0x80);
                auVar101 = vblendmps_avx512vl(auVar98,(undefined1  [16])t.field_0);
                bVar70 = (bool)(bVar82 >> 1 & 1);
                bVar7 = (bool)(bVar82 >> 2 & 1);
                *(uint *)(ray + 0x80) =
                     (uint)(bVar82 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar98._0_4_
                ;
                *(uint *)(ray + 0x84) =
                     (uint)bVar70 * auVar101._4_4_ | (uint)!bVar70 * auVar98._4_4_;
                *(uint *)(ray + 0x88) = (uint)bVar7 * auVar101._8_4_ | (uint)!bVar7 * auVar98._8_4_;
                *(uint *)(ray + 0x8c) =
                     (uint)(bVar82 >> 3) * auVar101._12_4_ |
                     (uint)!(bool)(bVar82 >> 3) * auVar98._12_4_;
                local_37a8 = vpmovm2d_avx512vl(uVar77);
                p1.field_0._0_8_ = local_37a8;
                p1.field_0._8_8_ = pGVar5->userPtr;
                p1.field_0._16_8_ = context->user;
                p1.field_0._32_8_ = &p0;
                p1.field_0._40_4_ = 4;
                p1.field_0._24_8_ = ray;
                if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar5->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                }
                uVar77 = vptestmd_avx512vl(local_37a8,local_37a8);
                if ((uVar77 & 0xf) == 0) {
                  uVar77 = 0;
                }
                else {
                  p_Var6 = context->args->filter;
                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                  }
                  uVar77 = vptestmd_avx512vl(local_37a8,local_37a8);
                  uVar77 = uVar77 & 0xf;
                  auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar70 = (bool)((byte)uVar77 & 1);
                  bVar7 = (bool)((byte)(uVar77 >> 1) & 1);
                  bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
                  bVar9 = SUB81(uVar77 >> 3,0);
                  *(uint *)(p1.field_0._24_8_ + 0x80) =
                       (uint)bVar70 * auVar101._0_4_ |
                       (uint)!bVar70 * *(int *)(p1.field_0._24_8_ + 0x80);
                  *(uint *)(p1.field_0._24_8_ + 0x84) =
                       (uint)bVar7 * auVar101._4_4_ |
                       (uint)!bVar7 * *(int *)(p1.field_0._24_8_ + 0x84);
                  *(uint *)(p1.field_0._24_8_ + 0x88) =
                       (uint)bVar8 * auVar101._8_4_ |
                       (uint)!bVar8 * *(int *)(p1.field_0._24_8_ + 0x88);
                  *(uint *)(p1.field_0._24_8_ + 0x8c) =
                       (uint)bVar9 * auVar101._12_4_ |
                       (uint)!bVar9 * *(int *)(p1.field_0._24_8_ + 0x8c);
                }
                bVar70 = (bool)((byte)uVar77 & 1);
                bVar7 = (bool)((byte)(uVar77 >> 1) & 1);
                bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
                bVar9 = SUB81(uVar77 >> 3,0);
                *(uint *)local_3798 =
                     (uint)bVar70 * *(int *)local_3798 | (uint)!bVar70 * auVar98._0_4_;
                *(uint *)(local_3798 + 4) =
                     (uint)bVar7 * *(int *)(local_3798 + 4) | (uint)!bVar7 * auVar98._4_4_;
                *(uint *)(local_3798 + 8) =
                     (uint)bVar8 * *(int *)(local_3798 + 8) | (uint)!bVar8 * auVar98._8_4_;
                *(uint *)(local_3798 + 0xc) =
                     (uint)bVar9 * *(int *)(local_3798 + 0xc) | (uint)!bVar9 * auVar98._12_4_;
              }
              bVar83 = ((byte)uVar77 ^ 0xf) & bVar83;
              auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar90 = vxorps_avx512vl(auVar90,auVar90);
              auVar104 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            }
            auVar182 = ZEXT1664(auVar104);
            auVar181 = ZEXT1664(auVar90);
            auVar180 = ZEXT1664(auVar103);
            auVar179 = ZEXT1664(auVar100);
            auVar178 = ZEXT1664(auVar101);
            auVar177 = ZEXT1664(auVar98);
          }
        }
      }
      auVar90 = auVar181._0_16_;
      if (bVar83 == 0) {
        bVar83 = 0;
        goto LAB_01d7e1cb;
      }
      auVar98 = vsubps_avx512vl(auVar94,auVar95);
      auVar101 = vsubps_avx512vl(auVar92,auVar106);
      auVar100 = vsubps_avx512vl(auVar96,auVar107);
      auVar103 = vsubps_avx512vl(auVar93,auVar94);
      auVar104 = vsubps_avx512vl(auVar91,auVar92);
      auVar97 = vsubps_avx512vl(auVar97,auVar96);
      auVar95 = vmulps_avx512vl(auVar101,auVar97);
      vVar114.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vfmsub231ps_fma(auVar95,auVar104,auVar100)
      ;
      auVar126._0_4_ = auVar100._0_4_ * auVar103._0_4_;
      auVar126._4_4_ = auVar100._4_4_ * auVar103._4_4_;
      auVar126._8_4_ = auVar100._8_4_ * auVar103._8_4_;
      auVar126._12_4_ = auVar100._12_4_ * auVar103._12_4_;
      vVar115.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmsub231ps_avx512vl(auVar126,auVar97,auVar98);
      auVar130._0_4_ = auVar104._0_4_ * auVar98._0_4_;
      auVar130._4_4_ = auVar104._4_4_ * auVar98._4_4_;
      auVar130._8_4_ = auVar104._8_4_ * auVar98._8_4_;
      auVar130._12_4_ = auVar104._12_4_ * auVar98._12_4_;
      auVar93 = vfmsub231ps_fma(auVar130,auVar103,auVar101);
      auVar105 = vsubps_avx512vl(auVar94,*(undefined1 (*) [16])ray);
      auVar116 = vsubps_avx512vl(auVar92,*(undefined1 (*) [16])(ray + 0x10));
      auVar117 = vsubps_avx512vl(auVar96,*(undefined1 (*) [16])(ray + 0x20));
      auVar95 = *(undefined1 (*) [16])(ray + 0x40);
      auVar91 = *(undefined1 (*) [16])(ray + 0x50);
      auVar92 = *(undefined1 (*) [16])(ray + 0x60);
      auVar94 = vmulps_avx512vl(auVar91,auVar117);
      auVar94 = vfmsub231ps_fma(auVar94,auVar116,auVar92);
      auVar173._0_4_ = auVar92._0_4_ * auVar105._0_4_;
      auVar173._4_4_ = auVar92._4_4_ * auVar105._4_4_;
      auVar173._8_4_ = auVar92._8_4_ * auVar105._8_4_;
      auVar173._12_4_ = auVar92._12_4_ * auVar105._12_4_;
      auVar96 = vfmsub231ps_fma(auVar173,auVar117,auVar95);
      auVar176._0_4_ = auVar95._0_4_ * auVar116._0_4_;
      auVar176._4_4_ = auVar95._4_4_ * auVar116._4_4_;
      auVar176._8_4_ = auVar95._8_4_ * auVar116._8_4_;
      auVar176._12_4_ = auVar95._12_4_ * auVar116._12_4_;
      auVar118 = vfmsub231ps_avx512vl(auVar176,auVar105,auVar91);
      auVar159._0_4_ = auVar92._0_4_ * auVar93._0_4_;
      auVar159._4_4_ = auVar92._4_4_ * auVar93._4_4_;
      auVar159._8_4_ = auVar92._8_4_ * auVar93._8_4_;
      auVar159._12_4_ = auVar92._12_4_ * auVar93._12_4_;
      auVar91 = vfmadd231ps_avx512vl(auVar159,(undefined1  [16])vVar115.field_0,auVar91);
      auVar95 = vfmadd231ps_fma(auVar91,(undefined1  [16])vVar114.field_0,auVar95);
      auVar91 = vandps_avx512vl(auVar95,auVar182._0_16_);
      auVar92 = vmulps_avx512vl(auVar97,auVar118);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar104);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar94,auVar103);
      auVar92 = vxorps_avx512vl(auVar91,auVar92);
      uVar10 = vcmpps_avx512vl(auVar92,auVar90,5);
      bVar82 = (byte)uVar10 & bVar83;
      if (bVar82 != 0) {
        auVar165._0_4_ = auVar100._0_4_ * auVar118._0_4_;
        auVar165._4_4_ = auVar100._4_4_ * auVar118._4_4_;
        auVar165._8_4_ = auVar100._8_4_ * auVar118._8_4_;
        auVar165._12_4_ = auVar100._12_4_ * auVar118._12_4_;
        auVar96 = vfmadd213ps_fma(auVar101,auVar96,auVar165);
        auVar94 = vfmadd213ps_fma(auVar98,auVar94,auVar96);
        auVar142._0_4_ = (float)(auVar91._0_4_ ^ auVar94._0_4_);
        auVar142._4_4_ = (float)(auVar91._4_4_ ^ auVar94._4_4_);
        auVar142._8_4_ = (float)(auVar91._8_4_ ^ auVar94._8_4_);
        auVar142._12_4_ = (float)(auVar91._12_4_ ^ auVar94._12_4_);
        uVar10 = vcmpps_avx512vl(auVar142,auVar90,5);
        bVar82 = bVar82 & (byte)uVar10;
        if (bVar82 != 0) {
          auVar96 = vandps_avx512vl(auVar95,auVar177._0_16_);
          auVar94 = vsubps_avx(auVar96,auVar92);
          uVar10 = vcmpps_avx512vl(auVar94,auVar142,5);
          bVar82 = bVar82 & (byte)uVar10;
          if (bVar82 != 0) {
            auVar163._0_4_ = auVar117._0_4_ * auVar93._0_4_;
            auVar163._4_4_ = auVar117._4_4_ * auVar93._4_4_;
            auVar163._8_4_ = auVar117._8_4_ * auVar93._8_4_;
            auVar163._12_4_ = auVar117._12_4_ * auVar93._12_4_;
            auVar94 = vfmadd213ps_fma(auVar116,(undefined1  [16])vVar115.field_0,auVar163);
            auVar94 = vfmadd213ps_fma(auVar105,(undefined1  [16])vVar114.field_0,auVar94);
            auVar156._0_4_ = auVar96._0_4_ * *(float *)(ray + 0x30);
            auVar156._4_4_ = auVar96._4_4_ * *(float *)(ray + 0x34);
            auVar156._8_4_ = auVar96._8_4_ * *(float *)(ray + 0x38);
            auVar156._12_4_ = auVar96._12_4_ * *(float *)(ray + 0x3c);
            auVar152._0_4_ = auVar91._0_4_ ^ auVar94._0_4_;
            auVar152._4_4_ = auVar91._4_4_ ^ auVar94._4_4_;
            auVar152._8_4_ = auVar91._8_4_ ^ auVar94._8_4_;
            auVar152._12_4_ = auVar91._12_4_ ^ auVar94._12_4_;
            auVar164._0_4_ = auVar96._0_4_ * *(float *)(ray + 0x80);
            auVar164._4_4_ = auVar96._4_4_ * *(float *)(ray + 0x84);
            auVar164._8_4_ = auVar96._8_4_ * *(float *)(ray + 0x88);
            auVar164._12_4_ = auVar96._12_4_ * *(float *)(ray + 0x8c);
            uVar10 = vcmpps_avx512vl(auVar152,auVar164,2);
            uVar11 = vcmpps_avx512vl(auVar156,auVar152,1);
            bVar82 = bVar82 & (byte)uVar10 & (byte)uVar11;
            if (bVar82 != 0) {
              uVar10 = vcmpps_avx512vl(auVar95,ZEXT816(0) << 0x20,4);
              bVar82 = bVar82 & (byte)uVar10;
              if (bVar82 != 0) {
                pGVar5 = (context->scene->geometries).items[*(uint *)(lVar85 + 0x40 + lVar78 * 4)].
                         ptr;
                uVar167 = pGVar5->mask;
                auVar157._4_4_ = uVar167;
                auVar157._0_4_ = uVar167;
                auVar157._8_4_ = uVar167;
                auVar157._12_4_ = uVar167;
                uVar10 = vptestmd_avx512vl(auVar157,*(undefined1 (*) [16])(ray + 0x90));
                bVar82 = bVar82 & (byte)uVar10 & 0xf;
                uVar77 = (ulong)bVar82;
                if (bVar82 != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar91 = vrcp14ps_avx512vl(auVar96);
                    auVar160._8_4_ = 0x3f800000;
                    auVar160._0_8_ = 0x3f8000003f800000;
                    auVar160._12_4_ = 0x3f800000;
                    auVar95 = vfnmadd213ps_fma(auVar96,auVar91,auVar160);
                    auVar91 = vfmadd132ps_fma(auVar95,auVar91,auVar91);
                    auVar136._0_4_ = auVar91._0_4_ * auVar92._0_4_;
                    auVar136._4_4_ = auVar91._4_4_ * auVar92._4_4_;
                    auVar136._8_4_ = auVar91._8_4_ * auVar92._8_4_;
                    auVar136._12_4_ = auVar91._12_4_ * auVar92._12_4_;
                    auVar95 = vminps_avx(auVar136,auVar160);
                    auVar143._0_4_ = auVar91._0_4_ * auVar142._0_4_;
                    auVar143._4_4_ = auVar91._4_4_ * auVar142._4_4_;
                    auVar143._8_4_ = auVar91._8_4_ * auVar142._8_4_;
                    auVar143._12_4_ = auVar91._12_4_ * auVar142._12_4_;
                    auVar91 = vminps_avx(auVar143,auVar160);
                    vsubps_avx(auVar160,auVar95);
                    vsubps_avx(auVar160,auVar91);
                    p1.field_0._0_8_ = &itime;
                    p1.field_0._8_8_ = &t;
                    p1.field_0._16_8_ = &v_1;
                    p1.field_0._24_8_ = &u;
                    p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar114.field_0
                    ;
                    p0.field_0.field_0.y.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar115.field_0
                    ;
                    p0.field_0._32_16_ = auVar93;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                       *)&p0);
                    auVar95 = vpbroadcastd_avx512vl();
                    vpbroadcastd_avx512vl();
                    p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)itime.field_0;
                    p0.field_0._24_8_ = uStack_3640;
                    p0.field_0._16_8_ = local_3648;
                    p0.field_0._40_8_ = uStack_3630;
                    p0.field_0._32_8_ = uStack_3638;
                    vpcmpeqd_avx2(ZEXT1632(auVar95),ZEXT1632(auVar95));
                    auVar95 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar91 = vblendmps_avx512vl(auVar95,(undefined1  [16])t.field_0);
                    bVar70 = (bool)(bVar82 >> 1 & 1);
                    bVar7 = (bool)(bVar82 >> 2 & 1);
                    *(uint *)(ray + 0x80) =
                         (uint)(bVar82 & 1) * auVar91._0_4_ |
                         (uint)!(bool)(bVar82 & 1) * auVar95._0_4_;
                    *(uint *)(ray + 0x84) =
                         (uint)bVar70 * auVar91._4_4_ | (uint)!bVar70 * auVar95._4_4_;
                    *(uint *)(ray + 0x88) =
                         (uint)bVar7 * auVar91._8_4_ | (uint)!bVar7 * auVar95._8_4_;
                    *(uint *)(ray + 0x8c) =
                         (uint)(bVar82 >> 3) * auVar91._12_4_ |
                         (uint)!(bool)(bVar82 >> 3) * auVar95._12_4_;
                    local_37a8 = vpmovm2d_avx512vl(uVar77);
                    p1.field_0._0_8_ = local_37a8;
                    p1.field_0._8_8_ = pGVar5->userPtr;
                    p1.field_0._16_8_ = context->user;
                    p1.field_0._32_8_ = &p0;
                    p1.field_0._40_4_ = 4;
                    p1.field_0._24_8_ = ray;
                    if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar5->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                    }
                    uVar77 = vptestmd_avx512vl(local_37a8,local_37a8);
                    if ((uVar77 & 0xf) == 0) {
                      uVar77 = 0;
                    }
                    else {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                      }
                      uVar77 = vptestmd_avx512vl(local_37a8,local_37a8);
                      uVar77 = uVar77 & 0xf;
                      auVar91 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar70 = (bool)((byte)uVar77 & 1);
                      bVar7 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar9 = SUB81(uVar77 >> 3,0);
                      *(uint *)(p1.field_0._24_8_ + 0x80) =
                           (uint)bVar70 * auVar91._0_4_ |
                           (uint)!bVar70 * *(int *)(p1.field_0._24_8_ + 0x80);
                      *(uint *)(p1.field_0._24_8_ + 0x84) =
                           (uint)bVar7 * auVar91._4_4_ |
                           (uint)!bVar7 * *(int *)(p1.field_0._24_8_ + 0x84);
                      *(uint *)(p1.field_0._24_8_ + 0x88) =
                           (uint)bVar8 * auVar91._8_4_ |
                           (uint)!bVar8 * *(int *)(p1.field_0._24_8_ + 0x88);
                      *(uint *)(p1.field_0._24_8_ + 0x8c) =
                           (uint)bVar9 * auVar91._12_4_ |
                           (uint)!bVar9 * *(int *)(p1.field_0._24_8_ + 0x8c);
                    }
                    bVar70 = (bool)((byte)uVar77 & 1);
                    auVar119._0_4_ =
                         (uint)bVar70 * *(int *)local_3798 | (uint)!bVar70 * auVar95._0_4_;
                    bVar70 = (bool)((byte)(uVar77 >> 1) & 1);
                    auVar119._4_4_ =
                         (uint)bVar70 * *(int *)(local_3798 + 4) | (uint)!bVar70 * auVar95._4_4_;
                    bVar70 = (bool)((byte)(uVar77 >> 2) & 1);
                    auVar119._8_4_ =
                         (uint)bVar70 * *(int *)(local_3798 + 8) | (uint)!bVar70 * auVar95._8_4_;
                    bVar70 = SUB81(uVar77 >> 3,0);
                    auVar119._12_4_ =
                         (uint)bVar70 * *(int *)(local_3798 + 0xc) | (uint)!bVar70 * auVar95._12_4_;
                    *(undefined1 (*) [16])local_3798 = auVar119;
                  }
                  bVar83 = ((byte)uVar77 ^ 0xf) & bVar83;
                  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar177 = ZEXT1664(auVar95);
                  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar178 = ZEXT1664(auVar95);
                  auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  auVar179 = ZEXT1664(auVar95);
                  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar180 = ZEXT1664(auVar95);
                  auVar90 = vxorps_avx512vl(auVar90,auVar90);
                  auVar181 = ZEXT1664(auVar90);
                  auVar90 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar182 = ZEXT1664(auVar90);
                  goto LAB_01d7d516;
                }
              }
            }
            auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar177 = ZEXT1664(auVar95);
            auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar178 = ZEXT1664(auVar95);
            auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar179 = ZEXT1664(auVar95);
            auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar180 = ZEXT1664(auVar95);
            auVar90 = vxorps_avx512vl(auVar90,auVar90);
            auVar181 = ZEXT1664(auVar90);
            auVar90 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar182 = ZEXT1664(auVar90);
          }
        }
      }
LAB_01d7d516:
      lVar78 = lVar78 + 1;
    } while (bVar83 != 0);
    bVar83 = 0;
LAB_01d7e1cb:
    lVar73 = lVar73 + 1;
    bVar69 = bVar69 & bVar83;
    uVar77 = local_3790;
  } while (bVar69 != 0);
  bVar69 = 0;
LAB_01d7e1ee:
  auVar90 = auVar179._0_16_;
  bVar81 = bVar81 | ~bVar69 & 0xf;
  local_3848 = (uint)bVar81;
  if (bVar81 == 0xf) {
    bVar81 = 0xf;
    goto LAB_01d7e34f;
  }
  auVar90 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar70 = (bool)(bVar81 >> 1 & 1);
  bVar7 = (bool)(bVar81 >> 2 & 1);
  bVar8 = (bool)(bVar81 >> 3 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar70 * auVar90._4_4_ | (uint)!bVar70 * tray.tfar.field_0.i[1];
  tray.tfar.field_0.i[0] =
       (uint)(bVar81 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar81 & 1) * tray.tfar.field_0.i[0];
  tray.tfar.field_0.i[2] = (uint)bVar7 * auVar90._8_4_ | (uint)!bVar7 * tray.tfar.field_0.i[2];
  tray.tfar.field_0.i[3] = (uint)bVar8 * auVar90._12_4_ | (uint)!bVar8 * tray.tfar.field_0.i[3];
  goto LAB_01d7cee1;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }